

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O1

void __thiscall
icu_63::FieldPositionIteratorHandler::shiftLast(FieldPositionIteratorHandler *this,int32_t delta)

{
  uint index;
  int iVar1;
  UVector32 *pUVar2;
  int32_t iVar3;
  
  if ((delta != 0) && (this->status < U_ILLEGAL_ARGUMENT_ERROR)) {
    pUVar2 = this->vec;
    iVar1 = pUVar2->count;
    if (0 < iVar1) {
      UVector32::setElementAt(pUVar2,pUVar2->elements[iVar1 - 1U] + delta,iVar1 - 1U);
      index = iVar1 - 2;
      pUVar2 = this->vec;
      iVar3 = 0;
      if (((iVar1 != 1) && (iVar3 = 0, 0 < pUVar2->count)) && ((int)index < pUVar2->count)) {
        iVar3 = pUVar2->elements[index];
      }
      UVector32::setElementAt(pUVar2,iVar3 + delta,index);
      return;
    }
  }
  return;
}

Assistant:

void
FieldPositionIteratorHandler::shiftLast(int32_t delta) {
  if (U_SUCCESS(status) && delta != 0) {
    int32_t i = vec->size();
    if (i > 0) {
      --i;
      vec->setElementAt(delta + vec->elementAti(i), i);
      --i;
      vec->setElementAt(delta + vec->elementAti(i), i);
    }
  }
}